

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nstime.c
# Opt level: O3

uint64_t duckdb_je_nstime_ns_since(nstime_t *past)

{
  ulong uVar1;
  ulong uVar2;
  nstime_t old_time;
  timespec ts;
  timespec local_28;
  
  uVar1 = past->ns;
  clock_gettime(6,&local_28);
  uVar2 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
  if (uVar2 < uVar1) {
    uVar2 = uVar1;
  }
  return uVar2 - past->ns;
}

Assistant:

uint64_t
nstime_ns_since(const nstime_t *past) {
	nstime_assert_initialized(past);

	nstime_t now;
	nstime_copy(&now, past);
	nstime_update(&now);

	assert(nstime_compare(&now, past) >= 0);
	return now.ns - past->ns;
}